

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__set_sampler(stbir__sampler *samp,stbir_filter filter,stbir__kernel_callback *kernel,
                       stbir__support_callback *support,stbir_edge edge,
                       stbir__scale_info *scale_info,int always_gather,void *user_data)

{
  int iVar1;
  int iVar2;
  stbir__support_callback *psVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  if (filter == STBIR_FILTER_DEFAULT) {
    if (1.0 <= scale_info->scale) {
      if (((1.0 < scale_info->scale) ||
          (fVar7 = (float)(int)scale_info->pixel_shift,
          fVar7 = (float)(-(uint)(fVar7 < scale_info->pixel_shift) & 0x3f800000) + fVar7,
          fVar7 != scale_info->pixel_shift)) || (NAN(fVar7) || NAN(scale_info->pixel_shift))) {
        filter = STBIR_FILTER_CATMULLROM;
      }
      else {
        filter = STBIR_FILTER_POINT_SAMPLE;
      }
    }
    else {
      filter = STBIR_FILTER_MITCHELL;
    }
    samp->filter_enum = filter;
  }
  else {
    samp->filter_enum = filter;
    if (STBIR_FILTER_POINT_SAMPLE < filter) {
      __assert_fail("(unsigned)samp->filter_enum < STBIR_FILTER_OTHER",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                    ,0x1970,
                    "void stbir__set_sampler(stbir__sampler *, stbir_filter, stbir__kernel_callback *, stbir__support_callback *, stbir_edge, stbir__scale_info *, int, void *)"
                   );
    }
  }
  samp->filter_kernel = stbir__builtin_kernels[filter];
  psVar3 = stbir__builtin_supports[filter];
  samp->filter_support = psVar3;
  if (support != (stbir__support_callback *)0x0 && kernel != (stbir__kernel_callback *)0x0) {
    samp->filter_kernel = kernel;
    samp->filter_support = support;
    samp->filter_enum = STBIR_FILTER_OTHER;
    psVar3 = support;
  }
  samp->edge = edge;
  fVar7 = scale_info->scale;
  if (1.0 <= fVar7) {
    fVar7 = (*psVar3)(1.0 / fVar7,user_data);
    fVar7 = fVar7 + fVar7;
  }
  else {
    fVar6 = (*psVar3)(fVar7,user_data);
    fVar7 = (fVar6 + fVar6) / fVar7;
  }
  iVar2 = (int)((float)(-(uint)((float)(int)fVar7 < fVar7) & 0x3f800000) + (float)(int)fVar7);
  samp->filter_pixel_width = iVar2;
  samp->is_gather = 0;
  if (1.0 <= scale_info->scale) {
    samp->is_gather = 1;
    fVar7 = 1.0 / (samp->scale_info).scale;
  }
  else {
    if ((always_gather != 0) || (iVar2 < 0x21)) {
      samp->is_gather = 2;
      fVar7 = (samp->scale_info).scale;
      fVar6 = (*samp->filter_support)(fVar7,user_data);
      fVar7 = (fVar6 + fVar6) / fVar7;
      goto LAB_00352ecf;
    }
    fVar7 = (samp->scale_info).scale;
  }
  fVar7 = (*samp->filter_support)(fVar7,user_data);
  fVar7 = fVar7 + fVar7;
LAB_00352ecf:
  iVar5 = (int)((float)(-(uint)((float)(int)fVar7 < fVar7) & 0x3f800000) + (float)(int)fVar7);
  samp->coefficient_width = iVar5;
  iVar2 = samp->filter_pixel_width;
  if (edge == STBIR_EDGE_WRAP) {
    iVar4 = scale_info->input_full_size;
    iVar1 = iVar4 * 3;
    if (iVar2 != iVar1 && SBORROW4(iVar2,iVar1) == iVar2 + iVar4 * -3 < 0) {
      samp->filter_pixel_width = iVar1;
      iVar2 = iVar1;
    }
    if (iVar2 / 2 < iVar4) {
      iVar4 = iVar2 / 2;
    }
    samp->filter_pixel_margin = iVar4;
  }
  else {
    iVar4 = iVar2 / 2;
    samp->filter_pixel_margin = iVar4;
  }
  if (samp->is_gather == 0) {
    iVar4 = iVar4 * 2 + (samp->scale_info).input_full_size;
  }
  else {
    iVar4 = (samp->scale_info).output_sub_size;
  }
  samp->num_contributors = iVar4;
  samp->contributors_size = iVar4 * 8;
  samp->coefficients_size = iVar5 * iVar4 * 4 + 4;
  samp->gather_prescatter_contributors = (stbir__contributors *)0x0;
  samp->gather_prescatter_coefficients = (float *)0x0;
  if (samp->is_gather == 0) {
    samp->gather_prescatter_coefficient_width = iVar2;
    iVar5 = (samp->scale_info).output_sub_size;
    samp->gather_prescatter_num_contributors = iVar5;
    samp->gather_prescatter_contributors_size = iVar5 * 8;
    samp->gather_prescatter_coefficients_size = iVar2 * iVar5 * 4;
  }
  return;
}

Assistant:

static void stbir__set_sampler(stbir__sampler * samp, stbir_filter filter, stbir__kernel_callback * kernel, stbir__support_callback * support, stbir_edge edge, stbir__scale_info * scale_info, int always_gather, void * user_data )
{
  // set filter
  if (filter == 0)
  {
    filter = STBIR_DEFAULT_FILTER_DOWNSAMPLE; // default to downsample
    if (scale_info->scale >= ( 1.0f - stbir__small_float ) )
    {
      if ( (scale_info->scale <= ( 1.0f + stbir__small_float ) ) && ( STBIR_CEILF(scale_info->pixel_shift) == scale_info->pixel_shift ) )
        filter = STBIR_FILTER_POINT_SAMPLE;
      else
        filter = STBIR_DEFAULT_FILTER_UPSAMPLE;
    }
  }
  samp->filter_enum = filter;

  STBIR_ASSERT(samp->filter_enum != 0);
  STBIR_ASSERT((unsigned)samp->filter_enum < STBIR_FILTER_OTHER);
  samp->filter_kernel = stbir__builtin_kernels[ filter ];
  samp->filter_support = stbir__builtin_supports[ filter ];

  if ( kernel && support )
  {
    samp->filter_kernel = kernel;
    samp->filter_support = support;
    samp->filter_enum = STBIR_FILTER_OTHER;
  }

  samp->edge = edge;
  samp->filter_pixel_width  = stbir__get_filter_pixel_width (samp->filter_support, scale_info->scale, user_data );
  // Gather is always better, but in extreme downsamples, you have to most or all of the data in memory
  //    For horizontal, we always have all the pixels, so we always use gather here (always_gather==1).
  //    For vertical, we use gather if scaling up (which means we will have samp->filter_pixel_width
  //    scanlines in memory at once).
  samp->is_gather = 0;
  if ( scale_info->scale >= ( 1.0f - stbir__small_float ) )
    samp->is_gather = 1;
  else if ( ( always_gather ) || ( samp->filter_pixel_width <= STBIR_FORCE_GATHER_FILTER_SCANLINES_AMOUNT ) )
    samp->is_gather = 2;

  // pre calculate stuff based on the above
  samp->coefficient_width = stbir__get_coefficient_width(samp, samp->is_gather, user_data);

  // filter_pixel_width is the conservative size in pixels of input that affect an output pixel.
  //   In rare cases (only with 2 pix to 1 pix with the default filters), it's possible that the 
  //   filter will extend before or after the scanline beyond just one extra entire copy of the 
  //   scanline (we would hit the edge twice). We don't let you do that, so we clamp the total 
  //   width to 3x the total of input pixel (once for the scanline, once for the left side 
  //   overhang, and once for the right side). We only do this for edge mode, since the other 
  //   modes can just re-edge clamp back in again.
  if ( edge == STBIR_EDGE_WRAP )
    if ( samp->filter_pixel_width > ( scale_info->input_full_size * 3 ) )
      samp->filter_pixel_width = scale_info->input_full_size * 3;

  // This is how much to expand buffers to account for filters seeking outside
  // the image boundaries.
  samp->filter_pixel_margin = samp->filter_pixel_width / 2;
  
  // filter_pixel_margin is the amount that this filter can overhang on just one side of either 
  //   end of the scanline (left or the right). Since we only allow you to overhang 1 scanline's 
  //   worth of pixels, we clamp this one side of overhang to the input scanline size. Again, 
  //   this clamping only happens in rare cases with the default filters (2 pix to 1 pix). 
  if ( edge == STBIR_EDGE_WRAP )
    if ( samp->filter_pixel_margin > scale_info->input_full_size )
      samp->filter_pixel_margin = scale_info->input_full_size;

  samp->num_contributors = stbir__get_contributors(samp, samp->is_gather);

  samp->contributors_size = samp->num_contributors * sizeof(stbir__contributors);
  samp->coefficients_size = samp->num_contributors * samp->coefficient_width * sizeof(float) + sizeof(float); // extra sizeof(float) is padding

  samp->gather_prescatter_contributors = 0;
  samp->gather_prescatter_coefficients = 0;
  if ( samp->is_gather == 0 )
  {
    samp->gather_prescatter_coefficient_width = samp->filter_pixel_width;
    samp->gather_prescatter_num_contributors  = stbir__get_contributors(samp, 2);
    samp->gather_prescatter_contributors_size = samp->gather_prescatter_num_contributors * sizeof(stbir__contributors);
    samp->gather_prescatter_coefficients_size = samp->gather_prescatter_num_contributors * samp->gather_prescatter_coefficient_width * sizeof(float);
  }
}